

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

void Vec_WrdDoubleSimInfo(Vec_Wrd_t *p,int nObjs)

{
  word *pwVar1;
  ulong uVar2;
  word *__ptr;
  word *__src;
  int iVar3;
  int iVar4;
  
  iVar4 = p->nSize;
  pwVar1 = (word *)calloc((long)iVar4 * 2,8);
  iVar3 = iVar4 / nObjs;
  if (iVar4 % nObjs != 0) {
    __assert_fail("Vec_WrdSize(p) % nObjs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSim.c"
                  ,0x7b,"void Vec_WrdDoubleSimInfo(Vec_Wrd_t *, int)");
  }
  if (nObjs < 1) {
    __ptr = p->pArray;
  }
  else {
    __ptr = p->pArray;
    uVar2 = (ulong)(uint)nObjs;
    iVar4 = 0;
    __src = __ptr;
    do {
      memcpy(pwVar1 + iVar4,__src,(long)iVar3 * 8);
      __src = __src + iVar3;
      iVar4 = iVar4 + iVar3 * 2;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (__ptr != (word *)0x0) {
    free(__ptr);
  }
  p->pArray = pwVar1;
  iVar4 = iVar3 * nObjs * 2;
  p->nCap = iVar4;
  p->nSize = iVar4;
  return;
}

Assistant:

void Vec_WrdDoubleSimInfo( Vec_Wrd_t * p, int nObjs )
{
    word * pArray = ABC_CALLOC( word, 2 * Vec_WrdSize(p) );
    int i, nWords = Vec_WrdSize(p) / nObjs;
    assert( Vec_WrdSize(p) % nObjs == 0 );
    for ( i = 0; i < nObjs; i++ )
        memcpy( pArray + 2*i*nWords, p->pArray + i*nWords, sizeof(word) * nWords );
    ABC_FREE( p->pArray ); p->pArray = pArray;
    p->nSize = p->nCap = 2*nWords*nObjs;
}